

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_compress.c
# Opt level: O3

wchar_t archive_compressor_compress_write(archive_write_filter *f,void *buff,size_t length)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  long *plVar4;
  int iVar5;
  wchar_t wVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  uint uVar12;
  
  if (length != 0) {
    plVar4 = (long *)f->data;
    if (*plVar4 == 0) {
      *(uint *)((long)plVar4 + 0x65164) = (uint)*buff;
      *plVar4 = 1;
      length = length - 1;
      if (length == 0) {
        return L'\0';
      }
      buff = (void *)((long)buff + 1);
    }
    do {
      bVar1 = *buff;
      *plVar4 = *plVar4 + 1;
      wVar6 = *(wchar_t *)((long)plVar4 + 0x65164);
      iVar5 = (uint)bVar1 * 0x10000 + wVar6;
      *(int *)(plVar4 + 0xca2d) = iVar5;
      uVar12 = wVar6 ^ (uint)bVar1 << 8;
      iVar10 = *(int *)((long)plVar4 + (long)(int)uVar12 * 4 + 0x24);
      if (iVar10 == iVar5) {
        uVar2 = *(ushort *)((long)plVar4 + (long)(int)uVar12 * 2 + 0x43648);
LAB_0021e928:
        *(uint *)((long)plVar4 + 0x65164) = (uint)uVar2;
      }
      else {
        if (-1 < iVar10) {
          iVar10 = uVar12 - 0x10d89;
          if ((uint)bVar1 << 8 == wVar6) {
            iVar10 = -1;
          }
          do {
            uVar9 = uVar12 + iVar10;
            uVar12 = uVar12 + 0x10d89 + iVar10;
            if (-1 < (int)uVar9) {
              uVar12 = uVar9;
            }
            iVar3 = *(int *)((long)plVar4 + 0x24 + (long)(int)uVar12 * 4);
            if (iVar3 == iVar5) {
              uVar2 = *(ushort *)((long)plVar4 + (long)(int)uVar12 * 2 + 0x43648);
              goto LAB_0021e928;
            }
          } while (-1 < iVar3);
        }
        wVar6 = output_code(f,wVar6);
        if (wVar6 != L'\0') {
          return wVar6;
        }
        *(uint *)((long)plVar4 + 0x65164) = (uint)bVar1;
        iVar10 = *(int *)((long)plVar4 + 0x6515c);
        if (iVar10 < (int)plVar4[4]) {
          *(int *)((long)plVar4 + 0x6515c) = iVar10 + 1;
          *(short *)((long)plVar4 + (long)(int)uVar12 * 2 + 0x43648) = (short)iVar10;
          *(int *)((long)plVar4 + (long)(int)uVar12 * 4 + 0x24) = (int)plVar4[0xca2d];
        }
        else {
          lVar7 = *plVar4;
          if (plVar4[2] <= lVar7) {
            plVar4[2] = lVar7 + 10000;
            lVar8 = plVar4[1];
            if (lVar7 < 0x800000) {
              if (lVar8 == 0) goto LAB_0021e95f;
              lVar7 = lVar7 << 8;
LAB_0021e958:
              iVar10 = (int)(lVar7 / lVar8);
            }
            else {
              lVar11 = lVar8 + 0xff;
              if (-1 < lVar8) {
                lVar11 = lVar8;
              }
              iVar10 = (int)((ulong)lVar11 >> 8);
              if (iVar10 != 0) {
                lVar8 = (long)iVar10;
                goto LAB_0021e958;
              }
LAB_0021e95f:
              iVar10 = 0x7fffffff;
            }
            if ((int)plVar4[0xca2c] < iVar10) {
              *(int *)(plVar4 + 0xca2c) = iVar10;
            }
            else {
              *(undefined4 *)(plVar4 + 0xca2c) = 0;
              memset((void *)((long)plVar4 + 0x24),0xff,0x43624);
              *(undefined4 *)((long)plVar4 + 0x6515c) = 0x101;
              wVar6 = output_code(f,L'Ā');
              if (wVar6 != L'\0') {
                return wVar6;
              }
            }
          }
        }
      }
      length = length - 1;
      buff = (void *)((long)buff + 1);
    } while (length != 0);
  }
  return L'\0';
}

Assistant:

static int
archive_compressor_compress_write(struct archive_write_filter *f,
    const void *buff, size_t length)
{
	struct private_data *state = (struct private_data *)f->data;
	int i;
	int ratio;
	int c, disp, ret;
	const unsigned char *bp;

	if (length == 0)
		return ARCHIVE_OK;

	bp = buff;

	if (state->in_count == 0) {
		state->cur_code = *bp++;
		++state->in_count;
		--length;
	}

	while (length--) {
		c = *bp++;
		state->in_count++;
		state->cur_fcode = (c << 16) + state->cur_code;
		i = ((c << HSHIFT) ^ state->cur_code);	/* Xor hashing. */

		if (state->hashtab[i] == state->cur_fcode) {
			state->cur_code = state->codetab[i];
			continue;
		}
		if (state->hashtab[i] < 0)	/* Empty slot. */
			goto nomatch;
		/* Secondary hash (after G. Knott). */
		if (i == 0)
			disp = 1;
		else
			disp = HSIZE - i;
 probe:
		if ((i -= disp) < 0)
			i += HSIZE;

		if (state->hashtab[i] == state->cur_fcode) {
			state->cur_code = state->codetab[i];
			continue;
		}
		if (state->hashtab[i] >= 0)
			goto probe;
 nomatch:
		ret = output_code(f, state->cur_code);
		if (ret != ARCHIVE_OK)
			return ret;
		state->cur_code = c;
		if (state->first_free < state->max_maxcode) {
			state->codetab[i] = state->first_free++;	/* code -> hashtable */
			state->hashtab[i] = state->cur_fcode;
			continue;
		}
		if (state->in_count < state->checkpoint)
			continue;

		state->checkpoint = state->in_count + CHECK_GAP;

		if (state->in_count <= 0x007fffff && state->out_count != 0)
			ratio = (int)(state->in_count * 256 / state->out_count);
		else if ((ratio = (int)(state->out_count / 256)) == 0)
			ratio = 0x7fffffff;
		else
			ratio = (int)(state->in_count / ratio);

		if (ratio > state->compress_ratio)
			state->compress_ratio = ratio;
		else {
			state->compress_ratio = 0;
			memset(state->hashtab, 0xff, sizeof(state->hashtab));
			state->first_free = FIRST;
			ret = output_code(f, CLEAR);
			if (ret != ARCHIVE_OK)
				return ret;
		}
	}

	return (ARCHIVE_OK);
}